

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O2

__type __thiscall NS::wrap<int,char_const*>(NS *this,int first,char *rest)

{
  pointer in_RAX;
  _Head_base<0UL,_N_*,_false> extraout_RDX;
  undefined4 in_register_00000034;
  __type _Var1;
  pointer local_28;
  
  local_28 = in_RAX;
  wrap<int>((NS *)&local_28,first);
  wrap<char_const*>(this,(char *)CONCAT44(in_register_00000034,first));
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_28;
  _Var1.super__Tuple_impl<0UL,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  _Var1.super__Tuple_impl<0UL,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl =
       (_Head_base<1UL,_N_*,_false>)(_Head_base<1UL,_N_*,_false>)this;
  return (__type)_Var1.super__Tuple_impl<0UL,_N_*,_N_*>;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }